

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.h
# Opt level: O0

void __thiscall
QOpenGLFunctions::glCompressedTexImage2D
          (QOpenGLFunctions *this,GLenum target,GLint level,GLenum internalformat,GLsizei width,
          GLsizei height,GLint border,GLsizei imageSize,void *data)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  
  (**(code **)(*in_RDI + 0x1e8))(in_ESI,in_EDX,in_ECX,in_R8D,in_R9D,in_stack_00000008);
  return;
}

Assistant:

inline void QOpenGLFunctions::glCompressedTexImage2D(GLenum target, GLint level, GLenum internalformat, GLsizei width, GLsizei height, GLint border, GLsizei imageSize, const void* data)
{
#if QT_CONFIG(opengles2) && defined(Q_OS_ANDROID)
    ::glCompressedTexImage2D(target, level, internalformat, width, height, border, imageSize, data);
#else
    Q_ASSERT(QOpenGLFunctions::isInitialized(d_ptr));
    d_ptr->f.CompressedTexImage2D(target, level, internalformat, width, height, border, imageSize, data);
#endif
    Q_OPENGL_FUNCTIONS_DEBUG
}